

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O0

ssize_t __thiscall
Lodtalk::MethodAssembler::Assembler::send
          (Assembler *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  SingleBytecodeInstruction *this_00;
  InstructionNode *pIVar2;
  SendMessage *this_01;
  size_t sVar3;
  undefined4 in_register_00000034;
  anon_union_8_4_0eb573b0_for_Oop_0 local_30;
  Oop specialSelector;
  int i;
  int argumentCount_local;
  Assembler *this_local;
  Oop selector_local;
  
  this_local = (Assembler *)CONCAT44(in_register_00000034,__fd);
  specialSelector.field_0.uintValue._4_4_ = SUB84(__buf,0);
  specialSelector.field_0.uintValue._0_4_ = 0;
  while( true ) {
    if (0x1f < (int)specialSelector.field_0.intValue._0_4_) {
      this_01 = (SendMessage *)operator_new(0x30);
      sVar3 = addLiteral(this,(Oop)this_local);
      SendMessage::SendMessage(this_01,(int)sVar3,specialSelector.field_0.intValue._4_4_);
      pIVar2 = addInstruction(this,(InstructionNode *)this_01);
      return (ssize_t)pIVar2;
    }
    local_30 = (anon_union_8_4_0eb573b0_for_Oop_0)
               VMContext::getSpecialMessageSelector
                         (this->context,specialSelector.field_0.uintValue._0_4_);
    bVar1 = Oop::operator==((Oop *)&this_local,(Oop *)&local_30);
    if (bVar1) break;
    specialSelector.field_0.uintValue._0_4_ = specialSelector.field_0.uintValue._0_4_ + 1;
  }
  this_00 = (SingleBytecodeInstruction *)operator_new(0x30);
  SingleBytecodeInstruction::SingleBytecodeInstruction
            (this_00,specialSelector.field_0.uintValue._0_4_ + 0x60,false);
  pIVar2 = addInstruction(this,(InstructionNode *)this_00);
  return (ssize_t)pIVar2;
}

Assistant:

InstructionNode *Assembler::send(Oop selector, int argumentCount)
{
    for(int i = 0; i < (int)SpecialMessageSelector::SpecialMessageOptimizedCount; ++i)
    {
        auto specialSelector = context->getSpecialMessageSelector(SpecialMessageSelector(i));
        if(selector == specialSelector)
            return addInstruction(new SingleBytecodeInstruction(BytecodeSet::SpecialMessageAdd + i, false));
    }
	return addInstruction(new SendMessage((int)addLiteral(selector), argumentCount));
}